

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::StoreValue
          (FlagImpl *this,void *src,ValueSource source)

{
  ptr_t pvVar1;
  iterator __position;
  FlagOpFn p_Var2;
  long lVar3;
  vector<void*,std::allocator<void*>> *pvVar4;
  uint uVar5;
  atomic<long> *paVar6;
  void *pvVar7;
  atomic<unsigned_long> *dst;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar8;
  __atomic_base<long> _Var9;
  int64_t one_word_val;
  __atomic_base<long> local_30;
  
  uVar5 = *(uint *)&this->field_0x28 >> 1 & 3;
  if (uVar5 < 2) {
    paVar6 = OneWordValue(this);
    local_30._M_i = (paVar6->super___atomic_base<long>)._M_i;
    pvVar7 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
    memcpy(&local_30,src,(size_t)pvVar7);
    paVar6 = OneWordValue(this);
    (paVar6->super___atomic_base<long>)._M_i = local_30._M_i;
  }
  else {
    if (uVar5 == 2) {
      dst = AtomicBufferValue(this);
      pvVar7 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      SequenceLock::Write(&this->seq_lock_,dst,src,(size_t)pvVar7);
      goto LAB_00104c29;
    }
    paVar8 = PtrStorage(this);
    pvVar1 = (paVar8->_M_i).ptr_;
    if ((~(uint)pvVar1 & 3) == 0) {
      local_30._M_i = (ulong)pvVar1 & 0xfffffffffffffffc;
      absl::lts_20240722::Mutex::Lock();
      if ((anonymous_namespace)::s_freelist == (vector<void*,std::allocator<void*>> *)0x0) {
        (anonymous_namespace)::s_freelist =
             (vector<void*,std::allocator<void*>> *)operator_new(0x18);
        *(undefined8 *)(anonymous_namespace)::s_freelist = 0;
        *(undefined8 *)((anonymous_namespace)::s_freelist + 8) = 0;
        *(undefined8 *)((anonymous_namespace)::s_freelist + 0x10) = 0;
      }
      pvVar4 = (anonymous_namespace)::s_freelist;
      __position._M_current = *(void ***)((anonymous_namespace)::s_freelist + 8);
      if (__position._M_current == *(void ***)((anonymous_namespace)::s_freelist + 0x10)) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((anonymous_namespace)::s_freelist,__position,(void **)&local_30);
      }
      else {
        *__position._M_current = (void *)local_30._M_i;
        *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 8;
      }
      absl::lts_20240722::Mutex::Unlock();
      p_Var2 = this->op_;
      pvVar7 = (*p_Var2)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
      (*p_Var2)(kCopyConstruct,src,pvVar7,(void *)0x0);
      MaskedPointer::MaskedPointer((MaskedPointer *)&local_30,pvVar7,source == kCommandLine);
      _Var9._M_i = local_30._M_i;
    }
    else {
      (*this->op_)(kCopy,src,(void *)((ulong)pvVar1 & 0xfffffffffffffffc),(void *)0x0);
      _Var9._M_i = (ulong)(source == kCommandLine) | (ulong)pvVar1;
    }
    paVar8 = PtrStorage(this);
    (paVar8->_M_i).ptr_ = (ptr_t)_Var9._M_i;
  }
  lVar3 = (this->seq_lock_).lock_.super___atomic_base<long>._M_i;
  if (lVar3 == -1) {
    __assert_fail("val != kUninitialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                  ,0x88,"void absl::flags_internal::SequenceLock::IncrementModificationCount()");
  }
  (this->seq_lock_).lock_.super___atomic_base<long>._M_i = lVar3 + 2;
LAB_00104c29:
  this->field_0x29 = this->field_0x29 | 4;
  InvokeCallback(this);
  return;
}

Assistant:

void FlagImpl::StoreValue(const void* src, ValueSource source) {
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      // Load the current value to avoid setting 'init' bit manually.
      int64_t one_word_val = OneWordValue().load(std::memory_order_acquire);
      std::memcpy(&one_word_val, src, Sizeof(op_));
      OneWordValue().store(one_word_val, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      seq_lock_.Write(AtomicBufferValue(), src, Sizeof(op_));
      break;
    }
    case FlagValueStorageKind::kHeapAllocated:
      MaskedPointer ptr_value = PtrStorage().load(std::memory_order_acquire);

      if (ptr_value.IsUnprotectedReadCandidate() && ptr_value.HasBeenRead()) {
        // If current value is a candidate for an unprotected read and if it was
        // already read at least once, follow up reads (if any) are done without
        // mutex protection. We can't guarantee it is safe to reuse this memory
        // since it may have been accessed by another thread concurrently, so
        // instead we move the memory to a freelist so it can still be safely
        // accessed, and allocate a new one for the new value.
        AddToFreelist(ptr_value.Ptr());
        ptr_value = MaskedPointer(Clone(op_, src), source == kCommandLine);
      } else {
        // Current value either was set programmatically or was never read.
        // We can reuse the memory since all accesses to this value (if any)
        // were protected by mutex. That said, if a new value comes from command
        // line it now becomes a candidate for an unprotected read.
        ptr_value.Set(op_, src, source == kCommandLine);
      }

      PtrStorage().store(ptr_value, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
  }
  modified_ = true;
  InvokeCallback();
}